

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

bool embree::avx::SphereMiIntersector1<4,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  byte bVar16;
  bool bVar17;
  Scene *pSVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  int local_1bc;
  Primitive *local_1b8;
  float local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined8 local_19c;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  RTCFilterFunctionNArguments local_170;
  RayQueryContext *local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  Scene *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar46 [64];
  
  pSVar18 = context->scene;
  pGVar7 = (pSVar18->geometries).items[sphere->sharedGeomID].ptr;
  lVar8 = *(long *)&pGVar7->field_0x58;
  _Var9 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar23 = *(undefined1 (*) [16])(lVar8 + (sphere->primIDs).field_0.i[0] * _Var9);
  auVar24 = *(undefined1 (*) [16])(lVar8 + (sphere->primIDs).field_0.i[1] * _Var9);
  auVar28 = *(undefined1 (*) [16])(lVar8 + (sphere->primIDs).field_0.i[2] * _Var9);
  auVar31 = *(undefined1 (*) [16])(lVar8 + (sphere->primIDs).field_0.i[3] * _Var9);
  auVar32 = vunpcklps_avx(auVar23,auVar28);
  auVar28 = vunpckhps_avx(auVar23,auVar28);
  auVar23 = vunpcklps_avx(auVar24,auVar31);
  auVar31 = vunpckhps_avx(auVar24,auVar31);
  auVar40 = vunpcklps_avx(auVar32,auVar23);
  auVar32 = vunpckhps_avx(auVar32,auVar23);
  auVar26 = vunpcklps_avx(auVar28,auVar31);
  auVar23 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar24 = vpcmpgtd_avx(auVar23,_DAT_01f7fcf0);
  local_48 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  aVar6 = (ray->dir).field_0;
  auVar23 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  auVar20 = vunpckhps_avx(auVar28,auVar31);
  auVar28 = vrcpss_avx(auVar23,auVar23);
  auVar23 = ZEXT416((uint)(auVar28._0_4_ * (2.0 - auVar23._0_4_ * auVar28._0_4_)));
  auVar28 = vshufps_avx(auVar23,auVar23,0);
  uVar1 = *(undefined4 *)&(ray->org).field_0;
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23 = vsubps_avx(auVar40,auVar23);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar31._4_4_ = uVar1;
  auVar31._0_4_ = uVar1;
  auVar31._8_4_ = uVar1;
  auVar31._12_4_ = uVar1;
  auVar31 = vsubps_avx(auVar32,auVar31);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar32 = vsubps_avx(auVar26,auVar32);
  fVar2 = (ray->dir).field_0.m128[0];
  auVar47 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = (ray->dir).field_0.m128[1];
  auVar48 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  fVar4 = (ray->dir).field_0.m128[2];
  auVar49 = ZEXT1664(CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))));
  auVar33._0_4_ =
       auVar28._0_4_ * (fVar2 * auVar23._0_4_ + fVar3 * auVar31._0_4_ + fVar4 * auVar32._0_4_);
  auVar33._4_4_ =
       auVar28._4_4_ * (fVar2 * auVar23._4_4_ + fVar3 * auVar31._4_4_ + fVar4 * auVar32._4_4_);
  auVar33._8_4_ =
       auVar28._8_4_ * (fVar2 * auVar23._8_4_ + fVar3 * auVar31._8_4_ + fVar4 * auVar32._8_4_);
  auVar33._12_4_ =
       auVar28._12_4_ * (fVar2 * auVar23._12_4_ + fVar3 * auVar31._12_4_ + fVar4 * auVar32._12_4_);
  auVar40._0_4_ = fVar2 * auVar33._0_4_;
  auVar40._4_4_ = fVar2 * auVar33._4_4_;
  auVar40._8_4_ = fVar2 * auVar33._8_4_;
  auVar40._12_4_ = fVar2 * auVar33._12_4_;
  auVar42._0_4_ = fVar3 * auVar33._0_4_;
  auVar42._4_4_ = fVar3 * auVar33._4_4_;
  auVar42._8_4_ = fVar3 * auVar33._8_4_;
  auVar42._12_4_ = fVar3 * auVar33._12_4_;
  auVar44._0_4_ = fVar4 * auVar33._0_4_;
  auVar44._4_4_ = fVar4 * auVar33._4_4_;
  auVar44._8_4_ = fVar4 * auVar33._8_4_;
  auVar44._12_4_ = fVar4 * auVar33._12_4_;
  auVar40 = vsubps_avx(auVar23,auVar40);
  auVar39 = ZEXT1664(auVar40);
  auVar31 = vsubps_avx(auVar31,auVar42);
  auVar41 = ZEXT1664(auVar31);
  auVar32 = vsubps_avx(auVar32,auVar44);
  auVar43 = ZEXT1664(auVar32);
  auVar36._0_4_ =
       auVar40._0_4_ * auVar40._0_4_ + auVar31._0_4_ * auVar31._0_4_ + auVar32._0_4_ * auVar32._0_4_
  ;
  auVar36._4_4_ =
       auVar40._4_4_ * auVar40._4_4_ + auVar31._4_4_ * auVar31._4_4_ + auVar32._4_4_ * auVar32._4_4_
  ;
  auVar36._8_4_ =
       auVar40._8_4_ * auVar40._8_4_ + auVar31._8_4_ * auVar31._8_4_ + auVar32._8_4_ * auVar32._8_4_
  ;
  auVar36._12_4_ =
       auVar40._12_4_ * auVar40._12_4_ +
       auVar31._12_4_ * auVar31._12_4_ + auVar32._12_4_ * auVar32._12_4_;
  auVar26._0_4_ = auVar20._0_4_ * auVar20._0_4_;
  auVar26._4_4_ = auVar20._4_4_ * auVar20._4_4_;
  auVar26._8_4_ = auVar20._8_4_ * auVar20._8_4_;
  auVar26._12_4_ = auVar20._12_4_ * auVar20._12_4_;
  auVar23 = vcmpps_avx(auVar36,auVar26,2);
  auVar20 = auVar24 & auVar23;
  if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar20[0xf] < '\0') {
    auVar23 = vandps_avx(auVar23,auVar24);
    auVar24 = vsubps_avx(auVar26,auVar36);
    auVar20._0_4_ = auVar28._0_4_ * auVar24._0_4_;
    auVar20._4_4_ = auVar28._4_4_ * auVar24._4_4_;
    auVar20._8_4_ = auVar28._8_4_ * auVar24._8_4_;
    auVar20._12_4_ = auVar28._12_4_ * auVar24._12_4_;
    auVar26 = vsqrtps_avx(auVar20);
    auVar50 = ZEXT1664(auVar26);
    auVar36 = vsubps_avx(auVar33,auVar26);
    auVar45._0_4_ = auVar26._0_4_ + auVar33._0_4_;
    auVar45._4_4_ = auVar26._4_4_ + auVar33._4_4_;
    auVar45._8_4_ = auVar26._8_4_ + auVar33._8_4_;
    auVar45._12_4_ = auVar26._12_4_ + auVar33._12_4_;
    auVar46 = ZEXT1664(auVar45);
    uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar27._4_4_ = uVar1;
    auVar27._0_4_ = uVar1;
    auVar27._8_4_ = uVar1;
    auVar27._12_4_ = uVar1;
    auVar24 = vcmpps_avx(auVar27,auVar36,2);
    fVar5 = ray->tfar;
    auVar34._4_4_ = fVar5;
    auVar34._0_4_ = fVar5;
    auVar34._8_4_ = fVar5;
    auVar34._12_4_ = fVar5;
    auVar28 = vcmpps_avx(auVar36,auVar34,2);
    auVar24 = vandps_avx(auVar28,auVar24);
    auVar37 = ZEXT1664(auVar24);
    auVar24 = vandps_avx(auVar24,auVar23);
    auVar28 = vcmpps_avx(auVar27,auVar45,2);
    auVar20 = vcmpps_avx(auVar45,auVar34,2);
    auVar28 = vandps_avx(auVar28,auVar20);
    auVar23 = vandps_avx(auVar28,auVar23);
    auVar38 = ZEXT1664(auVar23);
    auVar23 = vorps_avx(auVar24,auVar23);
    uVar15 = vmovmskps_avx(auVar23);
    if (uVar15 != 0) {
      auVar28._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar28._8_4_ = -auVar26._8_4_;
      auVar28._12_4_ = -auVar26._12_4_;
      local_128 = vblendvps_avx(auVar45,auVar36,auVar24);
      auVar23 = vblendvps_avx(auVar26,auVar28,auVar24);
      fVar5 = auVar23._0_4_;
      auVar29._0_4_ = fVar2 * fVar5;
      fVar12 = auVar23._4_4_;
      auVar29._4_4_ = fVar2 * fVar12;
      fVar13 = auVar23._8_4_;
      auVar29._8_4_ = fVar2 * fVar13;
      fVar14 = auVar23._12_4_;
      auVar29._12_4_ = fVar2 * fVar14;
      auVar35._0_4_ = fVar3 * fVar5;
      auVar35._4_4_ = fVar3 * fVar12;
      auVar35._8_4_ = fVar3 * fVar13;
      auVar35._12_4_ = fVar3 * fVar14;
      auVar24._0_4_ = fVar4 * fVar5;
      auVar24._4_4_ = fVar4 * fVar12;
      auVar24._8_4_ = fVar4 * fVar13;
      auVar24._12_4_ = fVar4 * fVar14;
      local_118 = vsubps_avx(auVar29,auVar40);
      local_108 = vsubps_avx(auVar35,auVar31);
      local_f8 = vsubps_avx(auVar24,auVar32);
      uVar19 = (ulong)(uVar15 & 0xff);
      local_1b8 = sphere;
      do {
        local_170.hit = (RTCHitN *)&local_1a8;
        local_170.valid = &local_1bc;
        auVar23 = auVar47._0_16_;
        uVar11 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        local_190 = *(uint *)(local_48 + uVar11 * 4);
        pGVar7 = (pSVar18->geometries).items[local_190].ptr;
        local_170.ray = (RTCRayN *)ray;
        if ((pGVar7->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar17 = true, auVar24 = auVar46._0_16_, auVar28 = auVar37._0_16_,
             auVar31 = auVar38._0_16_, auVar32 = auVar50._0_16_, auVar40 = auVar48._0_16_,
             auVar20 = auVar49._0_16_, auVar26 = auVar39._0_16_, auVar33 = auVar41._0_16_,
             auVar36 = auVar43._0_16_, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00dca4bd;
          local_d8 = auVar38._0_16_;
          local_c8 = auVar37._0_16_;
          local_b8 = auVar50._0_16_;
          local_a8 = auVar46._0_16_;
          local_98 = auVar43._0_16_;
          local_88 = auVar41._0_16_;
          local_78 = auVar39._0_16_;
          local_68 = auVar49._0_16_;
          local_58 = auVar48._0_16_;
          local_e0 = pSVar18;
          local_194 = (local_1b8->primIDs).field_0.i[uVar11];
          local_1a8 = *(undefined4 *)(local_118 + uVar11 * 4);
          local_1a4 = *(undefined4 *)(local_108 + uVar11 * 4);
          local_1a0 = *(undefined4 *)(local_f8 + uVar11 * 4);
          local_19c = 0;
          local_18c = context->user->instID[0];
          local_188 = context->user->instPrimID[0];
          local_1ac = ray->tfar;
          ray->tfar = *(float *)(local_128 + uVar11 * 4);
          local_1bc = -1;
          local_170.geometryUserPtr = pGVar7->userPtr;
          local_170.context = context->user;
          local_170.N = 1;
          local_138 = auVar23;
          if ((pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar7->occlusionFilterN)(&local_170), *local_170.valid != 0)) {
            p_Var10 = context->args->filter;
            if ((p_Var10 == (RTCFilterFunctionN)0x0) ||
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar7->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var10)(&local_170), *local_170.valid != 0)))) {
              bVar17 = true;
              auVar24 = local_a8;
              auVar28 = local_c8;
              auVar31 = local_d8;
              auVar23 = local_138;
              auVar32 = local_b8;
              auVar40 = local_58;
              auVar20 = local_68;
              auVar26 = local_78;
              auVar33 = local_88;
              auVar36 = local_98;
              goto LAB_00dca4bd;
            }
          }
          ray->tfar = local_1ac;
          auVar47 = ZEXT1664(local_138);
          auVar48 = ZEXT1664(local_58);
          auVar49 = ZEXT1664(local_68);
          auVar39 = ZEXT1664(local_78);
          auVar41 = ZEXT1664(local_88);
          auVar43 = ZEXT1664(local_98);
          auVar46 = ZEXT1664(local_a8);
          auVar50 = ZEXT1664(local_b8);
          auVar37 = ZEXT1664(local_c8);
          auVar38 = ZEXT1664(local_d8);
          pSVar18 = local_e0;
        }
        uVar19 = uVar19 ^ 1L << (uVar11 & 0x3f);
      } while (uVar19 != 0);
      bVar17 = false;
      auVar24 = auVar46._0_16_;
      auVar28 = auVar37._0_16_;
      auVar31 = auVar38._0_16_;
      auVar23 = auVar47._0_16_;
      auVar32 = auVar50._0_16_;
      auVar40 = auVar48._0_16_;
      auVar20 = auVar49._0_16_;
      auVar26 = auVar39._0_16_;
      auVar33 = auVar41._0_16_;
      auVar36 = auVar43._0_16_;
LAB_00dca4bd:
      fVar2 = ray->tfar;
      auVar21._4_4_ = fVar2;
      auVar21._0_4_ = fVar2;
      auVar21._8_4_ = fVar2;
      auVar21._12_4_ = fVar2;
      auVar42 = vcmpps_avx(auVar24,auVar21,2);
      auVar28 = vandps_avx(auVar28,auVar42);
      auVar28 = vandps_avx(auVar28,auVar31);
      uVar15 = vmovmskps_avx(auVar28);
      if (uVar15 == 0) {
        return bVar17;
      }
      fVar2 = auVar32._0_4_;
      auVar22._0_4_ = auVar23._0_4_ * fVar2;
      fVar3 = auVar32._4_4_;
      auVar22._4_4_ = auVar23._4_4_ * fVar3;
      fVar4 = auVar32._8_4_;
      auVar22._8_4_ = auVar23._8_4_ * fVar4;
      fVar5 = auVar32._12_4_;
      auVar22._12_4_ = auVar23._12_4_ * fVar5;
      auVar25._0_4_ = auVar40._0_4_ * fVar2;
      auVar25._4_4_ = auVar40._4_4_ * fVar3;
      auVar25._8_4_ = auVar40._8_4_ * fVar4;
      auVar25._12_4_ = auVar40._12_4_ * fVar5;
      auVar30._0_4_ = auVar20._0_4_ * fVar2;
      auVar30._4_4_ = auVar20._4_4_ * fVar3;
      auVar30._8_4_ = auVar20._8_4_ * fVar4;
      auVar30._12_4_ = auVar20._12_4_ * fVar5;
      local_118 = vsubps_avx(auVar22,auVar26);
      local_108 = vsubps_avx(auVar25,auVar33);
      local_f8 = vsubps_avx(auVar30,auVar36);
      local_128 = auVar24;
      pSVar18 = context->scene;
      uVar19 = (ulong)(uVar15 & 0xff);
      local_140 = context;
      do {
        local_170.hit = (RTCHitN *)&local_1a8;
        local_170.valid = &local_1bc;
        uVar11 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        local_190 = *(uint *)(local_48 + uVar11 * 4);
        pGVar7 = (pSVar18->geometries).items[local_190].ptr;
        if ((pGVar7->mask & ray->mask) != 0) {
          if ((local_140->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar16 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00dca6b3;
          local_194 = (local_1b8->primIDs).field_0.i[uVar11];
          local_1a8 = *(undefined4 *)(local_118 + uVar11 * 4);
          local_1a4 = *(undefined4 *)(local_108 + uVar11 * 4);
          local_1a0 = *(undefined4 *)(local_f8 + uVar11 * 4);
          local_19c = 0;
          local_18c = local_140->user->instID[0];
          local_188 = local_140->user->instPrimID[0];
          local_138._0_4_ = ray->tfar;
          ray->tfar = *(float *)(local_128 + uVar11 * 4);
          local_1bc = -1;
          local_170.geometryUserPtr = pGVar7->userPtr;
          local_170.context = local_140->user;
          local_170.N = 1;
          local_170.ray = (RTCRayN *)ray;
          if ((pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar7->occlusionFilterN)(&local_170), *local_170.valid != 0)) {
            p_Var10 = local_140->args->filter;
            if ((p_Var10 == (RTCFilterFunctionN)0x0) ||
               ((((local_140->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar7->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var10)(&local_170), *local_170.valid != 0)))) {
              bVar16 = 1;
              goto LAB_00dca6b3;
            }
          }
          ray->tfar = (float)local_138._0_4_;
        }
        uVar19 = uVar19 ^ 1L << (uVar11 & 0x3f);
        if (uVar19 == 0) {
          bVar16 = 0;
LAB_00dca6b3:
          return (bool)(bVar17 | bVar16);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        return SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }